

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O2

int __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,int __fd,sockaddr *__addr,
          socklen_t __len)

{
  int extraout_EAX;
  undefined4 in_register_00000034;
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::reactive_socket_service<asio::ip::udp>::bind
            ((this->impl_).service_,(int)this + 8,(sockaddr *)CONCAT44(in_register_00000034,__fd),
             (socklen_t)&local_28);
  asio::detail::throw_error(&local_28,"bind");
  return extraout_EAX;
}

Assistant:

void bind(const endpoint_type& endpoint)
  {
    asio::error_code ec;
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
  }